

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inst.cpp
# Opt level: O0

Error asmjit::v1_14::InstAPI::queryFeatures
                (Arch arch,BaseInst *inst,Operand_ *operands,size_t opCount,CpuFeatures *out)

{
  size_t in_RCX;
  Operand_ *in_RDX;
  BaseInst *in_RSI;
  char in_DIL;
  CpuFeatures *in_R8;
  CpuFeatures *in_stack_00000270;
  size_t in_stack_00000278;
  Operand_ *in_stack_00000280;
  BaseInst *in_stack_00000288;
  Arch in_stack_00000293;
  bool local_32;
  bool local_31;
  Error local_8;
  
  local_31 = in_DIL == '\x01' || in_DIL == '\x02';
  if (local_31) {
    local_8 = x86::InstInternal::queryFeatures
                        (in_stack_00000293,in_stack_00000288,in_stack_00000280,in_stack_00000278,
                         in_stack_00000270);
  }
  else {
    local_32 = in_DIL == '\x06' || in_DIL == '\f';
    if (local_32) {
      local_8 = a64::InstInternal::queryFeatures(in_RSI,in_RDX,in_RCX,in_R8);
    }
    else {
      local_8 = DebugUtils::errored(4);
    }
  }
  return local_8;
}

Assistant:

Error InstAPI::queryFeatures(Arch arch, const BaseInst& inst, const Operand_* operands, size_t opCount, CpuFeatures* out) noexcept {
#if !defined(ASMJIT_NO_X86)
  if (Environment::isFamilyX86(arch))
    return x86::InstInternal::queryFeatures(arch, inst, operands, opCount, out);
#endif

#if !defined(ASMJIT_NO_AARCH64)
  if (Environment::isFamilyAArch64(arch))
    return a64::InstInternal::queryFeatures(inst, operands, opCount, out);
#endif

  return DebugUtils::errored(kErrorInvalidArch);
}